

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O0

bool CheckShader(GLuint handle,char *desc)

{
  PFNGLGETSHADERINFOLOGPROC p_Var1;
  FILE *__stream;
  GLint GVar2;
  char *pcVar3;
  ImVector<char> *this;
  undefined8 in_RSI;
  GLuint in_EDI;
  ImVector<char> buf;
  GLint log_length;
  GLint status;
  undefined8 in_stack_ffffffffffffff98;
  ImVector<char> *in_stack_ffffffffffffffa0;
  ImVector<char> local_28;
  GLint local_18;
  uint local_14;
  undefined8 local_10;
  GLuint local_4;
  
  local_14 = 0;
  local_18 = 0;
  local_10 = in_RSI;
  local_4 = in_EDI;
  (*gl3wGetShaderiv)(in_EDI,0x8b81,(GLint *)&local_14);
  (*gl3wGetShaderiv)(local_4,0x8b84,&local_18);
  if ((local_14 & 0xff) == 0) {
    fprintf(_stderr,"ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s!\n",local_10
           );
  }
  if (1 < local_18) {
    ImVector<char>::ImVector(&local_28);
    ImVector<char>::resize
              (in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    GVar2 = local_18;
    p_Var1 = gl3wGetShaderInfoLog;
    pcVar3 = ImVector<char>::begin(&local_28);
    (*p_Var1)(local_4,GVar2,(GLsizei *)0x0,pcVar3);
    __stream = _stderr;
    this = (ImVector<char> *)ImVector<char>::begin(&local_28);
    fprintf(__stream,"%s\n",this);
    ImVector<char>::~ImVector(this);
  }
  return (local_14 & 0xff) == 1;
}

Assistant:

static bool CheckShader(GLuint handle, const char* desc)
{
    GLint status = 0, log_length = 0;
    glGetShaderiv(handle, GL_COMPILE_STATUS, &status);
    glGetShaderiv(handle, GL_INFO_LOG_LENGTH, &log_length);
    if ((GLboolean)status == GL_FALSE)
        fprintf(stderr, "ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s!\n", desc);
    if (log_length > 1)
    {
        ImVector<char> buf;
        buf.resize((int)(log_length + 1));
        glGetShaderInfoLog(handle, log_length, NULL, (GLchar*)buf.begin());
        fprintf(stderr, "%s\n", buf.begin());
    }
    return (GLboolean)status == GL_TRUE;
}